

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_process_mpr_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,nhdp_link *lnk,
               rfc5444_reader_tlvblock_entry *tlv)

{
  byte bVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  
  lnk->local_is_flooding_mpr = false;
  for (plVar3 = _domain_list.next; plVar3->prev != _domain_list.prev; plVar3 = plVar3->next) {
    lnk->neigh->_domaindata[*(int *)((long)&plVar3[-0x27].next + 4)].local_is_mpr = false;
  }
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    bVar1 = *tlv->single_value;
    lnk->local_is_flooding_mpr = (_Bool)(bVar1 & 1);
    if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
      pcVar7 = "false";
      if ((bVar1 & 1) != 0) {
        pcVar7 = "true";
      }
      oonf_log(1,(ulong)LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x289,0,0,
               "Flooding MPR for neighbor: %s",pcVar7);
    }
    if (mprtypes_size != 0) {
      sVar8 = 0;
      do {
        plVar3 = &_domain_list;
        do {
          plVar3 = plVar3->next;
          if (plVar3->prev == _domain_list.prev) goto LAB_001288be;
        } while (*(uint8_t *)((long)&plVar3[-0x27].next + 1) != mprtypes[sVar8]);
        uVar6 = sVar8 + 1 >> 3;
        if (uVar6 < tlv->length) {
          lnk->neigh->_domaindata[*(int *)((long)&plVar3[-0x27].next + 4)].local_is_mpr =
               (tlv->single_value[uVar6] >> ((uint)(sVar8 + 1) & 7) & 1) != 0;
          if (((&log_global_mask)[LOG_NHDP_R] & 1) != 0) {
            pcVar7 = "false";
            if (lnk->neigh->_domaindata[*(int *)((long)&plVar3[-0x27].next + 4)].local_is_mpr !=
                false) {
              pcVar7 = "true";
            }
            oonf_log(1,(ulong)LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x29c,0,0,
                     "Routing MPR for neighbor in domain %u: %s",
                     *(undefined1 *)((long)&plVar3[-0x27].next + 1),pcVar7);
          }
        }
LAB_001288be:
        sVar8 = sVar8 + 1;
      } while (sVar8 != mprtypes_size);
    }
    _node_is_selected_as_mpr = 0;
    for (plVar3 = _domain_list.next; plVar3->prev != _domain_list.prev; plVar3 = plVar3->next) {
      plVar4 = nhdp_db_get_neigh_list();
      while( true ) {
        plVar4 = plVar4->next;
        plVar2 = plVar4->prev;
        plVar5 = nhdp_db_get_neigh_list();
        if (plVar2 == plVar5->prev) break;
        if (*(char *)&plVar4[(long)*(int *)((long)&plVar3[-0x27].next + 4) * 2 + 6].next == '\x01')
        {
          _node_is_selected_as_mpr = 1;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_mpr_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct nhdp_link *lnk, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  struct nhdp_neighbor *neigh;
  size_t bit_idx, byte_idx;
  size_t i;

  lnk->local_is_flooding_mpr = false;
  list_for_each_element(&_domain_list, domain, _node) {
    nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr = false;
  }

  if (!tlv) {
    return;
  }

  /* set flooding MPR flag */
  lnk->local_is_flooding_mpr = (tlv->single_value[0] & RFC7181_MPR_FLOODING) != 0;
  OONF_DEBUG(LOG_NHDP_R, "Flooding MPR for neighbor: %s", lnk->local_is_flooding_mpr ? "true" : "false");

  /* set routing MPR flags */
  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }
    bit_idx = (i + 1) & 7;
    byte_idx = (i + 1) >> 3;

    if (byte_idx >= tlv->length) {
      continue;
    }

    nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr =
      (tlv->single_value[byte_idx] & (1 << bit_idx)) != 0;

    OONF_DEBUG(LOG_NHDP_R, "Routing MPR for neighbor in domain %u: %s", domain->ext,
      nhdp_domain_get_neighbordata(domain, lnk->neigh)->local_is_mpr ? "true" : "false");
  }

  _node_is_selected_as_mpr = false;
  list_for_each_element(&_domain_list, domain, _node) {
    list_for_each_element(nhdp_db_get_neigh_list(), neigh, _global_node) {
      if (nhdp_domain_get_neighbordata(domain, neigh)->local_is_mpr) {
        _node_is_selected_as_mpr = true;
        return;
      }
    }
  }
}